

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> *
OpenMD::operator||(ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons1,
                  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons2)

{
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> *in_RDI;
  EqualIgnoreCaseConstraint *in_stack_00000180;
  EqualIgnoreCaseConstraint *in_stack_00000188;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_00000190;
  EqualIgnoreCaseConstraint *in_stack_ffffffffffffff58;
  EqualIgnoreCaseConstraint *in_stack_ffffffffffffff60;
  
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
  OrParamConstraint(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)in_RDI);
  EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)in_RDI);
  return in_RDI;
}

Assistant:

inline OrParamConstraint<Cons1T, Cons2T> operator||(
      const ParamConstraintFacade<Cons1T>& cons1,
      const ParamConstraintFacade<Cons2T>& cons2) {
    return OrParamConstraint<Cons1T, Cons2T>(
        *static_cast<const Cons1T*>(&cons1),
        *static_cast<const Cons2T*>(&cons2));
  }